

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Publication * __thiscall
helics::ValueFederateManager::getPublication(ValueFederateManager *this,string_view key)

{
  bool bVar1;
  handle pubHandle;
  BlockIterator<helics::Publication,_32,_helics::Publication_**> pubF;
  handle local_60;
  BlockIterator<helics::Publication,_32,_helics::Publication_**> local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_60,&this->publications);
  gmlc::containers::
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  find(&local_48,local_60.data,key);
  gmlc::containers::StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>
  ::end(&local_30,&(local_60.data)->dataStorage);
  bVar1 = gmlc::containers::BlockIterator<helics::Publication,32,helics::Publication**>::operator!=
                    ((BlockIterator<helics::Publication,32,helics::Publication**> *)&local_48,
                     &local_30);
  if (!bVar1) {
    local_48.ptr = (Publication *)invalidPubNC;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60.m_handle_lock);
  return local_48.ptr;
}

Assistant:

Publication& ValueFederateManager::getPublication(std::string_view key)
{
    auto pubHandle = publications.lock();
    auto pubF = pubHandle->find(key);
    if (pubF != pubHandle->end()) {
        return *pubF;
    }
    return invalidPubNC;
}